

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void testDiamondCompare<wasm::analysis::ValType>
               (ValType *lattice,Element *bot,Element *a,Element *b,Element *top)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_440;
  Message local_438;
  LatticeComparison local_42c;
  uintptr_t local_428;
  uintptr_t local_420;
  LatticeComparison local_414;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_15;
  Message local_3f8;
  LatticeComparison local_3ec;
  uintptr_t local_3e8;
  uintptr_t local_3e0;
  LatticeComparison local_3d4;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_14;
  Message local_3b8;
  LatticeComparison local_3ac;
  uintptr_t local_3a8;
  uintptr_t local_3a0;
  LatticeComparison local_394;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_13;
  Message local_378;
  LatticeComparison local_36c;
  uintptr_t local_368;
  uintptr_t local_360;
  LatticeComparison local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_12;
  Message local_338;
  LatticeComparison local_32c;
  uintptr_t local_328;
  uintptr_t local_320;
  LatticeComparison local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_11;
  Message local_2f8;
  LatticeComparison local_2ec;
  uintptr_t local_2e8;
  uintptr_t local_2e0;
  LatticeComparison local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_10;
  Message local_2b8;
  LatticeComparison local_2ac;
  uintptr_t local_2a8;
  uintptr_t local_2a0;
  LatticeComparison local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_9;
  Message local_278;
  LatticeComparison local_26c;
  uintptr_t local_268;
  uintptr_t local_260;
  LatticeComparison local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_8;
  Message local_238;
  LatticeComparison local_22c;
  uintptr_t local_228;
  uintptr_t local_220;
  LatticeComparison local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_7;
  Message local_1f8;
  LatticeComparison local_1ec;
  uintptr_t local_1e8;
  uintptr_t local_1e0;
  LatticeComparison local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_6;
  Message local_1b8;
  LatticeComparison local_1ac;
  uintptr_t local_1a8;
  uintptr_t local_1a0;
  LatticeComparison local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_5;
  Message local_178;
  LatticeComparison local_16c;
  uintptr_t local_168;
  uintptr_t local_160;
  LatticeComparison local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_4;
  Message local_138;
  LatticeComparison local_12c;
  uintptr_t local_128;
  uintptr_t local_120;
  LatticeComparison local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  Message local_f8;
  LatticeComparison local_ec;
  uintptr_t local_e8;
  uintptr_t local_e0;
  LatticeComparison local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  LatticeComparison local_ac;
  uintptr_t local_a8;
  uintptr_t local_a0;
  LatticeComparison local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_68;
  LatticeComparison local_5c;
  uintptr_t local_58;
  uintptr_t local_50;
  LatticeComparison local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Element *top_local;
  Element *b_local;
  Element *a_local;
  Element *bot_local;
  ValType *lattice_local;
  
  local_50 = bot->id;
  local_58 = bot->id;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )top;
  local_44 = wasm::analysis::ValType::compare(lattice,(Element)local_50,(Element)local_58);
  local_5c = EQUAL;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_40,"lattice.compare(bot, bot)","analysis::EQUAL",&local_44,&local_5c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_a0 = bot->id;
  local_a8 = a->id;
  local_94 = wasm::analysis::ValType::compare(lattice,(Element)local_a0,(Element)local_a8);
  local_ac = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_90,"lattice.compare(bot, a)","analysis::LESS",&local_94,&local_ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_e0 = bot->id;
  local_e8 = b->id;
  local_d4 = wasm::analysis::ValType::compare(lattice,(Element)local_e0,(Element)local_e8);
  local_ec = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_d0,"lattice.compare(bot, b)","analysis::LESS",&local_d4,&local_ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_120 = bot->id;
  local_128 = *(uintptr_t *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  local_114 = wasm::analysis::ValType::compare(lattice,(Element)local_120,(Element)local_128);
  local_12c = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_110,"lattice.compare(bot, top)","analysis::LESS",&local_114,
             &local_12c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_160 = a->id;
  local_168 = bot->id;
  local_154 = wasm::analysis::ValType::compare(lattice,(Element)local_160,(Element)local_168);
  local_16c = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_150,"lattice.compare(a, bot)","analysis::GREATER",&local_154,
             &local_16c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_1a0 = a->id;
  local_1a8 = a->id;
  local_194 = wasm::analysis::ValType::compare(lattice,(Element)local_1a0,(Element)local_1a8);
  local_1ac = EQUAL;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_190,"lattice.compare(a, a)","analysis::EQUAL",&local_194,&local_1ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1e0 = a->id;
  local_1e8 = b->id;
  local_1d4 = wasm::analysis::ValType::compare(lattice,(Element)local_1e0,(Element)local_1e8);
  local_1ec = NO_RELATION;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_1d0,"lattice.compare(a, b)","analysis::NO_RELATION",&local_1d4,
             &local_1ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_220 = a->id;
  local_228 = *(uintptr_t *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  local_214 = wasm::analysis::ValType::compare(lattice,(Element)local_220,(Element)local_228);
  local_22c = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_210,"lattice.compare(a, top)","analysis::LESS",&local_214,&local_22c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_260 = b->id;
  local_268 = bot->id;
  local_254 = wasm::analysis::ValType::compare(lattice,(Element)local_260,(Element)local_268);
  local_26c = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_250,"lattice.compare(b, bot)","analysis::GREATER",&local_254,
             &local_26c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_2a0 = b->id;
  local_2a8 = a->id;
  local_294 = wasm::analysis::ValType::compare(lattice,(Element)local_2a0,(Element)local_2a8);
  local_2ac = NO_RELATION;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_290,"lattice.compare(b, a)","analysis::NO_RELATION",&local_294,
             &local_2ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_2e0 = b->id;
  local_2e8 = b->id;
  local_2d4 = wasm::analysis::ValType::compare(lattice,(Element)local_2e0,(Element)local_2e8);
  local_2ec = EQUAL;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_2d0,"lattice.compare(b, b)","analysis::EQUAL",&local_2d4,&local_2ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_320 = b->id;
  local_328 = *(uintptr_t *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  local_314 = wasm::analysis::ValType::compare(lattice,(Element)local_320,(Element)local_328);
  local_32c = LESS;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_310,"lattice.compare(b, top)","analysis::LESS",&local_314,&local_32c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_360 = *(uintptr_t *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  local_368 = bot->id;
  local_354 = wasm::analysis::ValType::compare(lattice,(Element)local_360,(Element)local_368);
  local_36c = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_350,"lattice.compare(top, bot)","analysis::GREATER",&local_354,
             &local_36c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  local_3a0 = *(uintptr_t *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  local_3a8 = a->id;
  local_394 = wasm::analysis::ValType::compare(lattice,(Element)local_3a0,(Element)local_3a8);
  local_3ac = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_390,"lattice.compare(top, a)","analysis::GREATER",&local_394,
             &local_3ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3e0 = *(uintptr_t *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  local_3e8 = b->id;
  local_3d4 = wasm::analysis::ValType::compare(lattice,(Element)local_3e0,(Element)local_3e8);
  local_3ec = GREATER;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_3d0,"lattice.compare(top, b)","analysis::GREATER",&local_3d4,
             &local_3ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  local_420 = *(uintptr_t *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  local_428 = *(uintptr_t *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  local_414 = wasm::analysis::ValType::compare(lattice,(Element)local_420,(Element)local_428);
  local_42c = EQUAL;
  testing::internal::EqHelper::
  Compare<wasm::analysis::LatticeComparison,_wasm::analysis::LatticeComparison,_nullptr>
            ((EqHelper *)local_410,"lattice.compare(top, top)","analysis::EQUAL",&local_414,
             &local_42c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_440,&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  return;
}

Assistant:

void testDiamondCompare(const L& lattice,
                        const typename L::Element& bot,
                        const typename L::Element& a,
                        const typename L::Element& b,
                        const typename L::Element& top) {
  EXPECT_EQ(lattice.compare(bot, bot), analysis::EQUAL);
  EXPECT_EQ(lattice.compare(bot, a), analysis::LESS);
  EXPECT_EQ(lattice.compare(bot, b), analysis::LESS);
  EXPECT_EQ(lattice.compare(bot, top), analysis::LESS);

  EXPECT_EQ(lattice.compare(a, bot), analysis::GREATER);
  EXPECT_EQ(lattice.compare(a, a), analysis::EQUAL);
  EXPECT_EQ(lattice.compare(a, b), analysis::NO_RELATION);
  EXPECT_EQ(lattice.compare(a, top), analysis::LESS);

  EXPECT_EQ(lattice.compare(b, bot), analysis::GREATER);
  EXPECT_EQ(lattice.compare(b, a), analysis::NO_RELATION);
  EXPECT_EQ(lattice.compare(b, b), analysis::EQUAL);
  EXPECT_EQ(lattice.compare(b, top), analysis::LESS);

  EXPECT_EQ(lattice.compare(top, bot), analysis::GREATER);
  EXPECT_EQ(lattice.compare(top, a), analysis::GREATER);
  EXPECT_EQ(lattice.compare(top, b), analysis::GREATER);
  EXPECT_EQ(lattice.compare(top, top), analysis::EQUAL);
}